

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O3

void __thiscall CppLogger::CppLogger::setFormat(CppLogger *this,Level t_Level,Format *t_Format)

{
  pointer pFVar1;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  _Var2;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_78;
  undefined4 local_5c;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_58;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_40;
  
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&local_58,&t_Format->m_Format);
  pFVar1 = local_58.
           super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&local_78,&t_Format->m_Format);
  local_5c = 4;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<CppLogger::FormatAttribute*,std::vector<CppLogger::FormatAttribute,std::allocator<CppLogger::FormatAttribute>>>,__gnu_cxx::__ops::_Iter_equals_val<CppLogger::FormatAttribute_const>>
                    (pFVar1,local_78.
                            super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&local_40,&t_Format->m_Format);
  if (local_40.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (_Var2._M_current ==
      local_40.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Format::addMessage(t_Format);
  }
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::operator=
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             (&this->field_0x28 + (long)(int)(t_Level - Trace) * 0x18),&t_Format->m_Format);
  return;
}

Assistant:

void CppLogger::setFormat(Level t_Level, Format& t_Format) {
        if (std::find(t_Format.getFormat().begin(), t_Format.getFormat().end(), FormatAttribute::Message) == t_Format.getFormat().end()) {
            t_Format.addMessage();
        }
        m_Format[t_Level - 1] = t_Format;
    }